

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom JS_NewAtomLen(JSContext *ctx,char *str,size_t len)

{
  int iVar1;
  JSAtom JVar2;
  long in_RDX;
  byte *in_RSI;
  JSValue v;
  size_t in_stack_00000010;
  JSAtom atom;
  JSValue val;
  undefined1 in_stack_ffffffffffffffb8 [16];
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  JSRuntime *in_stack_ffffffffffffffd8;
  JSAtom local_4;
  
  if ((in_RDX == 0) || (iVar1 = is_digit((uint)*in_RSI), iVar1 == 0)) {
    JVar2 = __JS_FindAtom(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffb8._12_4_);
    if (JVar2 != 0) {
      return JVar2;
    }
    in_stack_ffffffffffffffcc = 0;
  }
  v = JS_NewStringLen((JSContext *)val.tag,(char *)val.u.ptr,in_stack_00000010);
  iVar1 = JS_IsException(v);
  if (iVar1 == 0) {
    local_4 = JS_NewAtomStr((JSContext *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (JSString *)v.tag);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

JSAtom JS_NewAtomLen(JSContext *ctx, const char *str, size_t len)
{
    JSValue val;

    if (len == 0 || !is_digit(*str)) {
        JSAtom atom = __JS_FindAtom(ctx->rt, str, len, JS_ATOM_TYPE_STRING);
        if (atom)
            return atom;
    }
    val = JS_NewStringLen(ctx, str, len);
    if (JS_IsException(val))
        return JS_ATOM_NULL;
    return JS_NewAtomStr(ctx, JS_VALUE_GET_STRING(val));
}